

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O2

void tqapi_tapi_free_query_orders_result(TradeApi *tapi,QueryOrdersResult *result)

{
  QueryOrdersResultData *this;
  
  this = result->_data;
  if (this != (QueryOrdersResultData *)0x0) {
    QueryOrdersResultData::~QueryOrdersResultData(this);
  }
  operator_delete(this);
  operator_delete(result);
  return;
}

Assistant:

void tqapi_tapi_free_query_orders_result (TradeApi* tapi, QueryOrdersResult * result)
    {
        delete result->_data;
        delete result;
    }